

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O3

lm_trie_quant_t * lm_trie_quant_read_bin(FILE *fp,int order)

{
  lm_trie_quant_t *quant;
  size_t sVar1;
  int dummy;
  undefined1 local_14 [4];
  
  fread(local_14,4,1,(FILE *)fp);
  quant = lm_trie_quant_create(order);
  sVar1 = fread(quant->values,4,quant->nvalues,(FILE *)fp);
  if (sVar1 != quant->nvalues) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
            ,0xa5,"Failed to read %d quantization values\n");
    lm_trie_quant_free(quant);
    quant = (lm_trie_quant_t *)0x0;
  }
  return quant;
}

Assistant:

lm_trie_quant_t *
lm_trie_quant_read_bin(FILE * fp, int order)
{
    int dummy;
    lm_trie_quant_t *quant;

    fread(&dummy, sizeof(dummy), 1, fp);
    quant = lm_trie_quant_create(order);
    if (fread(quant->values, sizeof(*quant->values),
              quant->nvalues, fp) != quant->nvalues) {
        E_ERROR("Failed to read %d quantization values\n",
                quant->nvalues);
        lm_trie_quant_free(quant);
        return NULL;
    }
    if (SWAP_LM_TRIE) {
        size_t i;
        for (i = 0; i < quant->nvalues; ++i)
            SWAP_FLOAT32(&quant->values[i]);
    }

    return quant;
}